

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O2

int nn_xbus_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  nn_pipe *exclude;
  
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 == 0) {
    exclude = (nn_pipe *)0x0;
  }
  else {
    if (sVar2 != 8) {
      return -0x16;
    }
    puVar3 = (undefined8 *)nn_chunkref_data(&msg->sphdr);
    exclude = (nn_pipe *)*puVar3;
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_init(&msg->sphdr,0);
  }
  iVar1 = nn_dist_send((nn_dist *)(self + 1),msg,exclude);
  return iVar1;
}

Assistant:

int nn_xbus_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    size_t hdrsz;
    struct nn_pipe *exclude;

    hdrsz = nn_chunkref_size (&msg->sphdr);
    if (hdrsz == 0)
        exclude = NULL;
    else if (hdrsz == sizeof (uint64_t)) {
        memcpy (&exclude, nn_chunkref_data (&msg->sphdr), sizeof (exclude));
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, 0);
    }
    else
        return -EINVAL;

    return nn_dist_send (&nn_cont (self, struct nn_xbus, sockbase)->outpipes,
        msg, exclude);
}